

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O1

void soplex::MPSreadName(MPSInput *mps,SPxOut *spxout)

{
  char *t;
  ostream *poVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  size_t sVar5;
  char *pcVar6;
  Verbosity old_verbosity;
  Verbosity local_2c;
  
  bVar3 = MPSInput::readLine(mps);
  if (((bVar3) && (mps->m_f0 != (char *)0x0)) && (iVar4 = strcmp(mps->m_f0,"NAME"), iVar4 == 0)) {
    pcVar6 = "_MPS_";
    if (mps->m_f1 != (char *)0x0) {
      pcVar6 = mps->m_f1;
    }
    t = mps->m_probname;
    spxSnprintf(t,0x100,"%s",pcVar6);
    if ((spxout != (SPxOut *)0x0) && (3 < (int)spxout->m_verbosity)) {
      local_2c = spxout->m_verbosity;
      (*spxout->_vptr_SPxOut[2])(spxout);
      std::__ostream_insert<char,std::char_traits<char>>
                (spxout->m_streams[spxout->m_verbosity],"IMPSRD01 Problem name   : ",0x1a);
      poVar1 = spxout->m_streams[spxout->m_verbosity];
      sVar5 = strlen(t);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,t,sVar5);
      cVar2 = (char)spxout->m_streams[spxout->m_verbosity];
      std::ios::widen((char)*(undefined8 *)(*(long *)spxout->m_streams[spxout->m_verbosity] + -0x18)
                      + cVar2);
      std::ostream::put(cVar2);
      std::ostream::flush();
      (*spxout->_vptr_SPxOut[2])(spxout,&local_2c);
    }
    bVar3 = MPSInput::readLine(mps);
    if ((bVar3) && (pcVar6 = mps->m_f0, pcVar6 != (char *)0x0)) {
      iVar4 = strcmp(pcVar6,"ROWS");
      if (iVar4 == 0) {
        mps->m_section = ROWS;
        return;
      }
      iVar4 = strncmp(pcVar6,"OBJSEN",6);
      if (iVar4 == 0) {
        mps->m_section = OBJSEN;
        return;
      }
      iVar4 = strcmp(pcVar6,"OBJNAME");
      if (iVar4 == 0) {
        mps->m_section = OBJNAME;
        return;
      }
    }
  }
  MPSInput::syntaxError(mps);
  return;
}

Assistant:

static inline void MPSreadName(MPSInput& mps, SPxOut* spxout)
{
   do
   {
      // This has to be the Line with the NAME section.
      if(!mps.readLine() || (mps.field0() == nullptr) || strcmp(mps.field0(), "NAME"))
         break;

      // Sometimes the name is omitted.
      mps.setProbName((mps.field1() == nullptr) ? "_MPS_" : mps.field1());

      SPX_MSG_INFO2((*spxout), (*spxout) << "IMPSRD01 Problem name   : " << mps.probName() << std::endl;)

      // This has to be a new section
      if(!mps.readLine() || (mps.field0() == nullptr))
         break;

      if(!strcmp(mps.field0(), "ROWS"))
         mps.setSection(MPSInput::ROWS);
      else if(!strncmp(mps.field0(), "OBJSEN", 6))
         mps.setSection(MPSInput::OBJSEN);
      else if(!strcmp(mps.field0(), "OBJNAME"))
         mps.setSection(MPSInput::OBJNAME);
      else
         break;

      return;
   }
   while(false);

   mps.syntaxError();
}